

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_suite.cpp
# Opt level: O0

void replace_boolean(void)

{
  bool bVar1;
  type tVar2;
  basic_variable<std::allocator<char>_> local_b48;
  basic_variable<std::allocator<char>_> local_b18;
  iterator local_ae0;
  iterator local_ac8;
  bool local_aa9;
  basic_variable<std::allocator<char>_> local_aa8;
  basic_variable<std::allocator<char>_> local_a78;
  iterator local_a48;
  iterator local_a30;
  undefined1 local_a18 [8];
  variable data_7;
  basic_variable<std::allocator<char>_> local_9b8;
  iterator local_980;
  iterator local_968;
  bool local_949;
  basic_variable<std::allocator<char>_> local_948;
  basic_variable<std::allocator<char>_> local_918;
  iterator local_8e8;
  iterator local_8d0;
  undefined1 local_8b8 [8];
  variable data_6;
  basic_variable<std::allocator<char>_> local_858;
  iterator local_820;
  iterator local_808;
  bool local_7e9;
  basic_variable<std::allocator<char>_> local_7e8;
  basic_variable<std::allocator<char>_> local_7b8;
  iterator local_788;
  iterator local_770;
  undefined1 local_758 [8];
  variable data_5;
  basic_variable<std::allocator<char>_> local_6f8;
  iterator local_6c0;
  iterator local_6a8;
  bool local_689;
  basic_variable<std::allocator<char>_> local_688;
  basic_variable<std::allocator<char>_> local_658;
  iterator local_628;
  iterator local_610;
  undefined1 local_5f8 [8];
  variable data_4;
  double local_5c0;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  iterator local_550;
  iterator local_538;
  bool local_519;
  basic_variable<std::allocator<char>_> local_518;
  basic_variable<std::allocator<char>_> local_4e8;
  iterator local_4b8;
  iterator local_4a0;
  undefined1 local_488 [8];
  variable data_3;
  int local_44c;
  basic_variable<std::allocator<char>_> local_448;
  basic_variable<std::allocator<char>_> local_418;
  iterator local_3e0;
  iterator local_3c8;
  bool local_3a9;
  basic_variable<std::allocator<char>_> local_3a8;
  basic_variable<std::allocator<char>_> local_378;
  iterator local_348;
  iterator local_330;
  undefined1 local_318 [8];
  variable data_2;
  bool local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  basic_variable<std::allocator<char>_> local_2a8;
  iterator local_270;
  iterator local_258;
  bool local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  iterator local_1d8;
  iterator local_1c0;
  undefined1 local_1a8 [8];
  variable data_1;
  basic_variable<std::allocator<char>_> local_148;
  iterator local_110;
  iterator local_f8;
  bool local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_38,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_50,&local_78,&local_a8,&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x25,"void replace_boolean()",bVar1);
  local_d9 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_38,&local_d9);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x26,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_110,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_148,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_f8,&local_110,&local_148,
             (basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_148);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_110);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_impl
            ("data.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x28,"void replace_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_1a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1c0,(basic_variable<std::allocator<char>_> *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1d8,(basic_variable<std::allocator<char>_> *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_208,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_238,false);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_1c0,&local_1d8,&local_208,&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_1a8);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x2e,"void replace_boolean()",bVar1);
  local_239 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_1a8,&local_239);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x2f,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_258,(basic_variable<std::allocator<char>_> *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_270,(basic_variable<std::allocator<char>_> *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2a8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2d8,false);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_258,&local_270,&local_2a8,&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_1a8);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x31,"void replace_boolean()",bVar1);
  local_2d9 = false;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_1a8,&local_2d9);
  boost::detail::test_impl
            ("data == false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x32,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_318,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_330,(basic_variable<std::allocator<char>_> *)local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_348,(basic_variable<std::allocator<char>_> *)local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_378,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3a8,2);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_330,&local_348,&local_378,&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_378);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_330);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_318);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x38,"void replace_boolean()",bVar1);
  local_3a9 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_318,&local_3a9);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x39,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3c8,(basic_variable<std::allocator<char>_> *)local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3e0,(basic_variable<std::allocator<char>_> *)local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_418,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_448,2);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_3c8,&local_3e0,&local_418,&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3c8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                    ((basic_variable<std::allocator<char>_> *)local_318);
  boost::detail::test_impl
            ("data.is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x3b,"void replace_boolean()",bVar1);
  local_44c = 2;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_318,&local_44c);
  boost::detail::test_impl
            ("data == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x3c,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_488,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_4a0,(basic_variable<std::allocator<char>_> *)local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_4b8,(basic_variable<std::allocator<char>_> *)local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4e8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_518,3.0);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_4a0,&local_4b8,&local_4e8,&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_4a0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_488);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x42,"void replace_boolean()",bVar1);
  local_519 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_488,&local_519);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x43,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_538,(basic_variable<std::allocator<char>_> *)local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_550,(basic_variable<std::allocator<char>_> *)local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_588,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5b8,3.0);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_538,&local_550,&local_588,&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_550);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_538);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)local_488);
  boost::detail::test_impl
            ("data.is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x45,"void replace_boolean()",bVar1);
  local_5c0 = 3.0;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_488,&local_5c0);
  boost::detail::test_impl
            ("data == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x46,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_5f8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_610,(basic_variable<std::allocator<char>_> *)local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_628,(basic_variable<std::allocator<char>_> *)local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_658,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_688,"alpha");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_610,&local_628,&local_658,&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_610);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_5f8);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x4c,"void replace_boolean()",bVar1);
  local_689 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_5f8,&local_689);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x4d,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_6a8,(basic_variable<std::allocator<char>_> *)local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_6c0,(basic_variable<std::allocator<char>_> *)local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_6f8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_5.storage.field_0x28,"alpha");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_6a8,&local_6c0,&local_6f8,
             (basic_variable<std::allocator<char>_> *)&data_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_6a8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)local_5f8);
  boost::detail::test_impl
            ("data.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x4f,"void replace_boolean()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_5f8,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("data == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x50,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_758,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_770,(basic_variable<std::allocator<char>_> *)local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_788,(basic_variable<std::allocator<char>_> *)local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_7b8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7e8,L"bravo");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_770,&local_788,&local_7b8,&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_788);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_770);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_758);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x56,"void replace_boolean()",bVar1);
  local_7e9 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_758,&local_7e9);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x57,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_808,(basic_variable<std::allocator<char>_> *)local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_820,(basic_variable<std::allocator<char>_> *)local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_858,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_6.storage.field_0x28,L"bravo");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_808,&local_820,&local_858,
             (basic_variable<std::allocator<char>_> *)&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_820);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_808);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                    ((basic_variable<std::allocator<char>_> *)local_758);
  boost::detail::test_impl
            ("data.is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x59,"void replace_boolean()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_758,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("data == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x5a,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_758);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_8b8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_8d0,(basic_variable<std::allocator<char>_> *)local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8e8,(basic_variable<std::allocator<char>_> *)local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_918,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_948,L"charlie");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_8d0,&local_8e8,&local_918,&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_918);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8d0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_8b8);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x60,"void replace_boolean()",bVar1);
  local_949 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_8b8,&local_949);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x61,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_968,(basic_variable<std::allocator<char>_> *)local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_980,(basic_variable<std::allocator<char>_> *)local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_9b8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_7.storage.field_0x28,L"charlie");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_968,&local_980,&local_9b8,
             (basic_variable<std::allocator<char>_> *)&data_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_980);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_968);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    ((basic_variable<std::allocator<char>_> *)local_8b8);
  boost::detail::test_impl
            ("data.is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,99,"void replace_boolean()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_8b8,(char16_t (*) [8])L"charlie"
                    );
  boost::detail::test_impl
            ("data == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,100,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)local_a18,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a30,(basic_variable<std::allocator<char>_> *)local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a48,(basic_variable<std::allocator<char>_> *)local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_a78,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_aa8,L"delta");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_a30,&local_a48,&local_a78,&local_aa8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_aa8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a48);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a30);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_a18);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x6a,"void replace_boolean()",bVar1);
  local_aa9 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_a18,&local_aa9);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x6b,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_ac8,(basic_variable<std::allocator<char>_> *)local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_ae0,(basic_variable<std::allocator<char>_> *)local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_b18,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b48,L"delta");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_ac8,&local_ae0,&local_b18,&local_b48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b48);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b18);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ae0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_ac8);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_a18);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x6d,"void replace_boolean()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_a18,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x6e,"void replace_boolean()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a18);
  return;
}

Assistant:

void replace_boolean()
{
    // boolean - null
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable());
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable());
        TRIAL_PROTOCOL_TEST(data.is<nullable>());
    }
    // boolean - boolean
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable(false));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable(false));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == false);
    }
    // boolean - integer
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable(2));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable(2));
        TRIAL_PROTOCOL_TEST(data.is<integer>());
        TRIAL_PROTOCOL_TEST(data == 2);
    }
    // boolean - real
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable(3.0));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable(3.0));
        TRIAL_PROTOCOL_TEST(data.is<real>());
        TRIAL_PROTOCOL_TEST(data == 3.0);
    }
    // boolean - string
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable("alpha"));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable("alpha"));
        TRIAL_PROTOCOL_TEST(data.is<string>());
        TRIAL_PROTOCOL_TEST(data == "alpha");
    }
    // boolean - wstring
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable(L"bravo"));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable(L"bravo"));
        TRIAL_PROTOCOL_TEST(data.is<wstring>());
        TRIAL_PROTOCOL_TEST(data == L"bravo");
    }
    // boolean - u16string
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable(u"charlie"));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable(u"charlie"));
        TRIAL_PROTOCOL_TEST(data.is<u16string>());
        TRIAL_PROTOCOL_TEST(data == u"charlie");
    }
    // boolean - u32string
    {
        variable data(true);
        std::replace(data.begin(), data.end(), variable(false), variable(U"delta"));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
        std::replace(data.begin(), data.end(), variable(true), variable(U"delta"));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
    }
}